

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O3

void __thiscall QWidgetRepaintManager::paintAndFlush(QWidgetRepaintManager *this)

{
  long lVar1;
  QRegion *this_00;
  uint *puVar2;
  int iVar3;
  int iVar4;
  QWidgetPrivate *pQVar5;
  __uniq_ptr_data<QTLWExtra,_std::default_delete<QTLWExtra>,_true,_true> _Var6;
  long *plVar7;
  QWidget *pQVar8;
  QWidgetData *pQVar9;
  double dVar10;
  undefined1 auVar11 [16];
  char **__s;
  undefined1 auVar12 [16];
  QRegion QVar13;
  char cVar14;
  bool bVar15;
  QLoggingCategory *pQVar16;
  undefined8 uVar17;
  QGraphicsEffect *pQVar18;
  QWidget *pQVar19;
  long lVar20;
  undefined8 *puVar21;
  undefined8 *puVar22;
  QPoint QVar23;
  QPaintDevice *pQVar24;
  long lVar25;
  int iVar26;
  QWidgetRepaintManager *pQVar27;
  QPoint this_01;
  QVLABase<QWidget*> *pQVar28;
  QPoint *this_02;
  int iVar29;
  QPoint this_03;
  int iVar30;
  pointer *__ptr;
  long *plVar31;
  int iVar32;
  uint uVar33;
  QRect *rect;
  ulong uVar34;
  ulong uVar35;
  long *plVar36;
  long in_FS_OFFSET;
  QByteArrayView QVar37;
  QByteArrayView QVar38;
  QByteArrayView QVar39;
  QRegion newVisible;
  QRegion widgetDirty;
  QRegion dirtyBeforeSubtractedOpaqueChildren;
  bool hasDirtySiblingsAbove;
  QRegion toClean;
  QRegion dirtyCopy;
  QRect local_240;
  QPoint local_230;
  QPoint local_228;
  bool local_219;
  QRegion local_218;
  QRegion local_210;
  QDebug local_208;
  QtPrivate local_200 [8];
  QRectF local_1f8;
  undefined1 *puStack_1d8;
  undefined1 *local_1d0;
  undefined1 *puStack_1c8;
  undefined1 *local_1c0;
  undefined1 *puStack_1b8;
  undefined1 *local_1b0;
  undefined1 *puStack_1a8;
  undefined1 *local_1a0;
  undefined1 *puStack_198;
  undefined1 *local_190;
  undefined1 *puStack_188;
  undefined1 *local_180;
  undefined1 *puStack_178;
  undefined1 *local_170;
  undefined1 *puStack_168;
  int local_158;
  int iStack_154;
  int iStack_150;
  int iStack_14c;
  undefined8 uStack_148;
  char *local_140 [33];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar16 = QtPrivateLogging::lcWidgetPainting();
  if (((pQVar16->field_2).bools.enabledInfo._q_value._M_base._M_i & 1U) != 0) {
    local_140[0] = pQVar16->name;
    local_158 = 2;
    iStack_154 = 0;
    iStack_150 = 0;
    iStack_14c = 0;
    uStack_148._0_4_ = 0;
    uStack_148._4_4_ = 0;
    QMessageLogger::info();
    QVar13.d = local_218.d;
    QVar37.m_data = (storage_type *)0x1b;
    QVar37.m_size = (qsizetype)&local_1f8;
    QString::fromUtf8(QVar37);
    QTextStream::operator<<((QTextStream *)QVar13.d,(QString *)&local_1f8);
    if ((QPoint)local_1f8.xp != (QPoint)0x0) {
      LOCK();
      *(int *)local_1f8.xp = (int)*(Type *)local_1f8.xp + -1;
      UNLOCK();
      if ((__atomic_base<int>)*(__int_type *)local_1f8.xp == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_1f8.xp,2,0x10);
      }
    }
    if (*(QTextStream *)(local_218.d + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_218.d,' ');
    }
    QVar13.d = local_218.d;
    QVar38.m_data = (storage_type *)0x9;
    QVar38.m_size = (qsizetype)&local_1f8;
    QString::fromUtf8(QVar38);
    QTextStream::operator<<((QTextStream *)QVar13.d,(QString *)&local_1f8);
    if ((QPoint)local_1f8.xp != (QPoint)0x0) {
      LOCK();
      *(int *)local_1f8.xp = (int)*(Type *)local_1f8.xp + -1;
      UNLOCK();
      if ((__atomic_base<int>)*(__int_type *)local_1f8.xp == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_1f8.xp,2,0x10);
      }
    }
    if (*(QTextStream *)(local_218.d + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_218.d,' ');
    }
    local_210.d = local_218.d;
    *(int *)(local_218.d + 0x28) = *(int *)(local_218.d + 0x28) + 1;
    ::operator<<((Stream *)&local_240,&local_210);
    uVar17 = local_240._0_8_;
    QVar39.m_data = (storage_type *)0x11;
    QVar39.m_size = (qsizetype)&local_1f8;
    QString::fromUtf8(QVar39);
    QTextStream::operator<<((QTextStream *)uVar17,(QString *)&local_1f8);
    if ((QPoint)local_1f8.xp != (QPoint)0x0) {
      LOCK();
      *(int *)local_1f8.xp = (int)*(Type *)local_1f8.xp + -1;
      UNLOCK();
      if ((__atomic_base<int>)*(__int_type *)local_1f8.xp == (__atomic_base<int>)0x0) {
        QArrayData::deallocate((QArrayData *)local_1f8.xp,2,0x10);
      }
    }
    if (*(QTextStream *)(local_240._0_8_ + 0x30) == (QTextStream)0x1) {
      QTextStream::operator<<((QTextStream *)local_240._0_8_,' ');
    }
    *(int *)(local_240._0_8_ + 0x28) = *(int *)(local_240._0_8_ + 0x28) + 1;
    local_208.stream = (Stream *)0x0;
    local_1f8.xp = (qreal)local_240._0_8_;
    QtPrivate::printSequentialContainer<QList<QWidget*>>
              (local_200,(Stream *)&local_1f8,"QList",(QList<QWidget_*> *)(this + 0x18));
    QDebug::~QDebug((QDebug *)&local_1f8);
    QDebug::~QDebug((QDebug *)local_200);
    QDebug::~QDebug(&local_208);
    QDebug::~QDebug((QDebug *)&local_240);
    QDebug::~QDebug((QDebug *)&local_210);
    QDebug::~QDebug((QDebug *)&local_218);
  }
  lVar20 = *(long *)(*(long *)this + 0x20);
  uVar33 = *(uint *)(lVar20 + 8);
  iVar26 = *(int *)(lVar20 + 0x14);
  iVar29 = *(int *)(lVar20 + 0x18);
  iVar3 = *(int *)(lVar20 + 0x1c);
  iVar4 = *(int *)(lVar20 + 0x20);
  if ((uVar33 >> 10 & 1) == 0) {
    uVar17 = QBackingStore::size();
    plVar36 = QGuiApplicationPrivate::platform_integration;
    iVar30 = (iVar3 - iVar26) + 1;
    iVar32 = (iVar4 - iVar29) + 1;
    if ((iVar30 == (int)uVar17) && (iVar32 == (int)((ulong)uVar17 >> 0x20))) {
      bVar15 = false;
    }
    else if ((*(long *)(this + 0x78) == 0) ||
            ((uVar17 = QBackingStore::size(), (int)((ulong)uVar17 >> 0x20) < 1 || (int)uVar17 < 1 ||
             (cVar14 = (**(code **)(*plVar36 + 0x10))(plVar36), cVar14 == '\0')))) {
      pQVar27 = (QWidgetRepaintManager *)&local_158;
      QRegion::QRegion((QRegion *)pQVar27,0,0,iVar30,iVar32,Rectangle);
      uVar17 = *(undefined8 *)(this + 0x10);
      *(ulong *)(this + 0x10) = CONCAT44(iStack_154,local_158);
      local_158 = (int)uVar17;
      iStack_154 = (int)((ulong)uVar17 >> 0x20);
      QRegion::~QRegion((QRegion *)pQVar27);
      if (*(long *)(this + 0x28) != 0) {
        uVar35 = 0;
        do {
          resetWidget(pQVar27,*(QWidget **)(*(long *)(this + 0x20) + uVar35 * 8));
          uVar35 = uVar35 + 1;
        } while (uVar35 < *(ulong *)(this + 0x28));
      }
      QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x18));
      bVar15 = true;
    }
    else {
      local_158 = 0xaaaaaaaa;
      iStack_154 = 0xaaaaaaaa;
      iStack_150 = 0xaaaaaaaa;
      iStack_14c = 0xaaaaaaaa;
      uVar17 = QBackingStore::size();
      iStack_150 = (int)uVar17 + -1;
      local_158 = 0;
      iStack_154 = 0;
      iStack_14c = (int)((ulong)uVar17 >> 0x20) + -1;
      local_1f8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      staticContents((QWidgetRepaintManager *)&local_1f8,(QWidget *)this,(QRect *)0x0);
      local_240._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      bVar15 = false;
      QRegion::QRegion((QRegion *)&local_240,0,0,iVar30,iVar32,Rectangle);
      QRegion::operator-=((QRegion *)&local_240,(QRegion *)&local_1f8);
      QRegion::operator+=((QRegion *)(this + 0x10),(QRegion *)&local_240);
      QBackingStore::setStaticContents(*(QRegion **)(this + 8));
      QRegion::~QRegion((QRegion *)&local_240);
      QRegion::~QRegion((QRegion *)&local_1f8);
    }
  }
  else {
    bVar15 = false;
  }
  uVar17 = QBackingStore::size();
  iVar26 = (iVar3 - iVar26) + 1;
  iVar29 = (iVar4 - iVar29) + 1;
  if ((iVar26 != (int)uVar17) || (iVar29 != (int)((ulong)uVar17 >> 0x20))) {
    local_158 = iVar26;
    iStack_154 = iVar29;
    QBackingStore::resize(*(QSize **)(this + 8));
  }
  if ((uVar33 >> 10 & 1) != 0) goto LAB_0031bc61;
  local_218.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  QVar23 = (QPoint)((long)this + 0x10);
  QRegion::QRegion(&local_218,(QRegion *)QVar23);
  __s = local_140;
  memset(__s,0xaa,0x100);
  local_158 = 0x20;
  iStack_154 = 0;
  iStack_150 = 0;
  iStack_14c = 0;
  uVar35 = *(ulong *)(this + 0x28);
  if (uVar35 != 0) {
    uVar34 = 0;
    do {
      local_240._0_8_ = *(QPoint *)(*(long *)(this + 0x20) + uVar34 * 8);
      pQVar5 = *(QWidgetPrivate **)(local_240._0_8_ + 8);
      if (((pQVar5->data).field_0x12 & 4) == 0) {
        uStack_148 = __s;
        local_1f8._0_16_ = QWidgetPrivate::clipRect(pQVar5);
        this_00 = &pQVar5->dirty;
        QRegion::operator&=(this_00,(QRect *)&local_1f8);
        QWidgetPrivate::clipToEffectiveMask(pQVar5,this_00);
        local_219 = false;
        if ((pQVar5->field_0x252 & 0x20) == 0) {
          QWidgetPrivate::subtractOpaqueSiblings(pQVar5,this_00,&local_219,false);
        }
        local_228 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
        QRegion::QRegion((QRegion *)&local_228,this_00);
        if ((pQVar5->field_0x252 & 0x30) == 0) {
          lVar20 = *(long *)(local_240._0_8_ + 0x20);
          auVar12._4_4_ = *(int *)(lVar20 + 0x20) - *(int *)(lVar20 + 0x18);
          auVar12._0_4_ = *(int *)(lVar20 + 0x1c) - *(int *)(lVar20 + 0x14);
          auVar12._8_8_ = 0;
          local_1f8._0_16_ = auVar12 << 0x40;
          QWidgetPrivate::subtractOpaqueChildren(pQVar5,this_00,(QRect *)&local_1f8);
        }
        cVar14 = QRegion::isEmpty();
        if ((cVar14 != '\0') && ((pQVar5->field_0x253 & 2) != 0)) {
          QRegion::operator=(this_00,(QRegion *)&local_228);
        }
        pQVar27 = (QWidgetRepaintManager *)this_00;
        cVar14 = QRegion::isEmpty();
        if (cVar14 == '\0') {
          local_230 = (QPoint)&DAT_aaaaaaaaaaaaaaaa;
          if ((QPoint)local_240._0_8_ == *(QPoint *)this) {
            QRegion::QRegion((QRegion *)&local_230,this_00);
          }
          else {
            auVar11._8_8_ = 0;
            auVar11._0_8_ = local_1f8.yp;
            local_1f8._0_16_ = auVar11 << 0x40;
            QWidget::mapTo((QWidget *)local_240._0_8_,(QWidget *)*(QPoint *)this,
                           (QPoint *)&local_1f8);
            QRegion::translated((int)&local_230,(int)this_00);
          }
          pQVar27 = (QWidgetRepaintManager *)&local_218;
          QRegion::operator+=((QRegion *)pQVar27,(QRegion *)&local_230);
          this_03 = (QPoint)local_240._0_8_;
          if (*(long *)(*(long *)(*(long *)(*(long *)this + 8) + 0x78) + 0x10) == 0) {
            do {
              this_01 = this_03;
              pQVar18 = QWidget::graphicsEffect((QWidget *)this_03);
              if (pQVar18 != (QGraphicsEffect *)0x0) goto LAB_0031b515;
              this_03 = *(QPoint *)(*(long *)((long)this_03 + 8) + 0x10);
            } while (this_03 != (QPoint)0x0);
            if ((local_219 == false) && ((pQVar5->field_0x252 & 2) != 0)) {
              local_1f8._0_16_ = QRegion::boundingRect();
              this_01 = QVar23;
              cVar14 = QRegion::intersects((QRect *)QVar23);
              if (cVar14 == '\0') {
                if (CONCAT44(iStack_14c,iStack_150) == CONCAT44(iStack_154,local_158)) {
                  local_1f8.xp = (qreal)local_240._0_8_;
                  QVLABase<QWidget*>::emplace_back_impl<QWidget*>
                            ((QVLABase<QWidget*> *)&local_158,0x20,local_140,(QWidget **)&local_1f8)
                  ;
                }
                else {
                  QVLABase<QWidget*>::emplace_back_impl<QWidget*const&>
                            ((QVLABase<QWidget*> *)&local_158,0x20,local_140,(QWidget **)&local_240)
                  ;
                }
                goto LAB_0031b52c;
              }
            }
LAB_0031b515:
            resetWidget((QWidgetRepaintManager *)this_01,(QWidget *)local_240._0_8_);
            QRegion::operator+=((QRegion *)QVar23,(QRegion *)&local_230);
          }
          else {
            resetWidget(pQVar27,(QWidget *)local_240._0_8_);
          }
LAB_0031b52c:
          QRegion::~QRegion((QRegion *)&local_230);
        }
        else {
          resetWidget(pQVar27,(QWidget *)local_240._0_8_);
        }
        QRegion::~QRegion((QRegion *)&local_228);
        uVar35 = *(ulong *)(this + 0x28);
        __s = uStack_148;
      }
      uVar34 = uVar34 + 1;
    } while (uVar34 < uVar35);
  }
  uStack_148 = __s;
  QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x18));
  pQVar5 = *(QWidgetPrivate **)(*(long *)this + 8);
  QWidgetPrivate::createTLExtra(pQVar5);
  _Var6.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
  super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
  super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl =
       (((pQVar5->extra)._M_t.super___uniq_ptr_impl<QWExtra,_std::default_delete<QWExtra>_>._M_t.
         super__Tuple_impl<0UL,_QWExtra_*,_std::default_delete<QWExtra>_>.
         super__Head_base<0UL,_QWExtra_*,_false>._M_head_impl)->topextra)._M_t.
       super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>;
  plVar36 = *(long **)((long)_Var6.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                             super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 200);
  plVar7 = *(long **)((long)_Var6.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                            _M_t.
                            super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                            super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xd0);
  plVar31 = plVar36;
  if (plVar7 != plVar36) {
    do {
      if ((long *)*plVar31 != (long *)0x0) {
        (**(code **)(*(long *)*plVar31 + 0x20))();
      }
      *plVar31 = 0;
      plVar31 = plVar31 + 1;
    } while (plVar31 != plVar7);
    *(long **)((long)_Var6.super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t.
                     super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                     super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xd0) = plVar36;
  }
  findAllTextureWidgetsRecursively(*(QWidget **)this,*(QWidget **)this);
  pQVar27 = (QWidgetRepaintManager *)&local_218;
  cVar14 = QRegion::isEmpty();
  if (cVar14 == '\0') {
    plVar36 = *(long **)((long)_Var6.
                               super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>.
                               _M_t.
                               super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                               super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 200);
    plVar7 = *(long **)((long)_Var6.
                              super___uniq_ptr_impl<QTLWExtra,_std::default_delete<QTLWExtra>_>._M_t
                              .super__Tuple_impl<0UL,_QTLWExtra_*,_std::default_delete<QTLWExtra>_>.
                              super__Head_base<0UL,_QTLWExtra_*,_false>._M_head_impl + 0xd0);
    if (plVar36 != plVar7) {
      do {
        pQVar27 = (QWidgetRepaintManager *)*plVar36;
        iVar26 = QPlatformTextureList::count();
        if (0 < iVar26) {
          iVar26 = 0;
          do {
            lVar20 = QPlatformTextureList::source((int)*plVar36);
            if (*(long *)(this + 0x40) != 0) {
              lVar25 = 0;
              do {
                if (*(long *)(this + 0x40) << 3 == lVar25) goto LAB_0031b8f9;
                lVar1 = lVar25 + 8;
                plVar31 = (long *)(*(long *)(this + 0x38) + lVar25);
                lVar25 = lVar1;
              } while (*plVar31 != lVar20);
              if (lVar1 != 0) {
                local_1f8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                local_1f8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
                local_1f8._0_16_ = QPlatformTextureList::geometry((int)*plVar36);
                puVar2 = (uint *)(*(long *)(lVar20 + 8) + 0x250);
                *puVar2 = *puVar2 | 0x8000000;
                QRegion::operator+=((QRegion *)QVar23,(QRect *)&local_1f8);
                QRegion::operator+=(&local_218,(QRect *)&local_1f8);
              }
            }
LAB_0031b8f9:
            iVar26 = iVar26 + 1;
            pQVar27 = (QWidgetRepaintManager *)*plVar36;
            iVar29 = QPlatformTextureList::count();
          } while (iVar26 < iVar29);
        }
        plVar36 = plVar36 + 1;
      } while (plVar36 != plVar7);
    }
    if (*(long *)(this + 0x40) != 0) {
      uVar35 = 0;
      do {
        resetWidget(pQVar27,*(QWidget **)(*(long *)(this + 0x38) + uVar35 * 8));
        uVar35 = uVar35 + 1;
      } while (uVar35 < *(ulong *)(this + 0x40));
    }
    QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x30));
    if (*(long *)(*(long *)(*(long *)(*(long *)this + 8) + 0x78) + 0x10) == 0) {
      QBackingStore::beginPaint(*(QRegion **)(this + 8));
      updateStaticContentsSize(this);
      local_1f8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
      QRegion::QRegion((QRegion *)&local_1f8,(QRegion *)QVar23);
      QRegion::QRegion((QRegion *)&local_240);
      QVar23 = *(QPoint *)(this + 0x10);
      *(int *)(this + 0x10) = local_240.x1.m_i;
      *(int *)(this + 0x14) = local_240.y1.m_i;
      local_240._0_8_ = QVar23;
      QRegion::~QRegion((QRegion *)&local_240);
      this[0x88] = (QWidgetRepaintManager)0x0;
      if (0 < CONCAT44(iStack_14c,iStack_150)) {
        lVar20 = 0;
        do {
          pQVar8 = (QWidget *)uStack_148[lVar20];
          pQVar5 = *(QWidgetPrivate **)&pQVar8->field_0x8;
          uVar33 = *(uint *)&pQVar5->field_0x250;
          pQVar19 = *(QWidget **)this;
          this_02 = (QPoint *)&local_240;
          local_240._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
          QRegion::QRegion((QRegion *)this_02,&pQVar5->dirty);
          resetWidget((QWidgetRepaintManager *)this_02,pQVar8);
          local_228.xp.m_i = 0;
          local_228.yp.m_i = 0;
          if (pQVar8 != *(QWidget **)this) {
            local_230.xp.m_i = 0;
            local_230.yp.m_i = 0;
            QVar23 = QWidget::mapTo(pQVar8,*(QWidget **)this,&local_230);
            local_228.yp.m_i = local_228.yp.m_i + QVar23.yp.m_i.m_i;
            local_228.xp.m_i = local_228.xp.m_i + QVar23.xp.m_i.m_i;
          }
          pQVar24 = (QPaintDevice *)QBackingStore::paintDevice();
          QWidgetPrivate::drawWidget
                    (pQVar5,pQVar24,(QRegion *)&local_240,&local_228,
                     (DrawWidgetFlags)
                     ((uint)((uVar33 & 0x300000) == 0) * 0x20 + (uint)(pQVar8 == pQVar19) + 4),
                     (QPainter *)0x0,(QWidgetRepaintManager *)this);
          QRegion::~QRegion((QRegion *)&local_240);
          lVar20 = lVar20 + 1;
        } while (lVar20 < CONCAT44(iStack_14c,iStack_150));
      }
      if (bVar15) {
LAB_0031bbdd:
        pQVar5 = *(QWidgetPrivate **)(*(long *)this + 8);
        pQVar24 = (QPaintDevice *)QBackingStore::paintDevice();
        local_240.x1.m_i = 0;
        local_240.y1.m_i = 0;
        QWidgetPrivate::drawWidget
                  (pQVar5,pQVar24,(QRegion *)&local_1f8,(QPoint *)&local_240,(DrawWidgetFlags)0x105,
                   (QPainter *)0x0,(QWidgetRepaintManager *)this);
      }
      else {
        cVar14 = QRegion::isEmpty();
        if (cVar14 == '\0') goto LAB_0031bbdd;
      }
      QBackingStore::endPaint();
      flush(this);
      QRegion::~QRegion((QRegion *)&local_1f8);
    }
    else {
      updateStaticContentsSize(this);
      QRegion::QRegion((QRegion *)&local_1f8);
      uVar17 = *(undefined8 *)(this + 0x10);
      *(qreal *)(this + 0x10) = local_1f8.xp;
      local_1f8.xp = (qreal)uVar17;
      QRegion::~QRegion((QRegion *)&local_1f8);
      this[0x88] = (QWidgetRepaintManager)0x0;
      puVar21 = (undefined8 *)QRegion::begin();
      puVar22 = (undefined8 *)QRegion::end();
      if (puVar21 != puVar22) {
        do {
          iVar26 = (int)*puVar21;
          iVar29 = (int)((ulong)*puVar21 >> 0x20);
          dVar10 = (double)iVar29;
          local_1f8.yp._0_4_ = SUB84(dVar10,0);
          local_1f8.xp = (double)iVar26;
          local_1f8.yp._4_4_ = (int)((ulong)dVar10 >> 0x20);
          local_1f8.w = (qreal)(((long)*(int *)(puVar21 + 1) - (long)iVar26) + 1);
          local_1f8.h = (qreal)(((long)*(int *)((long)puVar21 + 0xc) - (long)iVar29) + 1);
          QGraphicsItem::update
                    ((QGraphicsItem *)
                     (*(long *)(*(long *)(*(long *)(*(long *)this + 8) + 0x78) + 0x10) + 0x10),
                     &local_1f8);
          puVar21 = puVar21 + 2;
        } while (puVar21 != puVar22);
      }
    }
  }
  else {
    local_1f8.w = (qreal)((long)&local_1f8 + 0x18);
    local_170 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_168 = &DAT_aaaaaaaaaaaaaaaa;
    local_180 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_178 = &DAT_aaaaaaaaaaaaaaaa;
    local_190 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_188 = &DAT_aaaaaaaaaaaaaaaa;
    local_1a0 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_198 = &DAT_aaaaaaaaaaaaaaaa;
    local_1b0 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_1a8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1c0 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_1b8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1d0 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_1c8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1f8.h = (qreal)&DAT_aaaaaaaaaaaaaaaa;
    puStack_1d8 = &DAT_aaaaaaaaaaaaaaaa;
    local_1f8._0_16_ = ZEXT816(0x10);
    uVar33 = (uint)*(undefined8 *)(this + 0x40);
    if (0x10 < (long)(int)uVar33) {
      QVLABase<QWidget_*>::reallocate_impl
                ((QVLABase<QWidget_*> *)&local_1f8,0x10,(void *)((long)&local_1f8 + 0x18),0,
                 (long)(int)uVar33);
    }
    if ((int)uVar33 < 1) {
      QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x30));
    }
    else {
      uVar35 = 0;
      do {
        local_228 = *(QPoint *)(*(long *)(this + 0x38) + uVar35 * 8);
        pQVar28 = (QVLABase<QWidget*> *)&local_1f8;
        if (local_1f8.yp == local_1f8.xp) {
          local_240._0_8_ = local_228;
          QVLABase<QWidget*>::emplace_back_impl<QWidget*>
                    ((QVLABase<QWidget*> *)&local_1f8,0x10,(void *)((long)&local_1f8 + 0x18),
                     (QWidget **)&local_240);
        }
        else {
          QVLABase<QWidget*>::emplace_back_impl<QWidget*const&>
                    ((QVLABase<QWidget*> *)&local_1f8,0x10,(void *)((long)&local_1f8 + 0x18),
                     (QWidget **)&local_228);
        }
        resetWidget((QWidgetRepaintManager *)pQVar28,(QWidget *)local_228);
        uVar35 = uVar35 + 1;
      } while ((uVar33 & 0x7fffffff) != uVar35);
      QList<QWidget_*>::clear((QList<QWidget_*> *)(this + 0x30));
      if (0 < (int)uVar33) {
        uVar35 = 0;
        do {
          pQVar8 = *(QWidget **)((long)local_1f8.w + uVar35 * 8);
          pQVar5 = *(QWidgetPrivate **)&pQVar8->field_0x8;
          pQVar9 = pQVar8->data;
          local_240.x2.m_i = (pQVar9->crect).x2.m_i - (pQVar9->crect).x1.m_i;
          local_240.y2.m_i = (pQVar9->crect).y2.m_i - (pQVar9->crect).y1.m_i;
          local_240.x1.m_i = 0;
          local_240.y1.m_i = 0;
          QRegion::QRegion((QRegion *)&local_228,&local_240,Rectangle);
          QWidgetPrivate::sendPaintEvent(pQVar5,(QRegion *)&local_228);
          QRegion::~QRegion((QRegion *)&local_228);
          if (pQVar8 != *(QWidget **)this) {
            pQVar19 = QWidget::nativeParentWidget(pQVar8);
            bVar15 = hasPlatformWindow(pQVar8);
            if ((bVar15) || ((pQVar19 != (QWidget *)0x0 && (pQVar19 != *(QWidget **)this)))) {
              bVar15 = hasPlatformWindow(pQVar8);
              if (bVar15) {
                pQVar19 = pQVar8;
              }
              QRegion::QRegion((QRegion *)&local_240);
              markNeedsFlush(this,pQVar19,(QRegion *)&local_240);
              QRegion::~QRegion((QRegion *)&local_240);
            }
          }
          uVar35 = uVar35 + 1;
        } while ((uVar33 & 0x7fffffff) != uVar35);
      }
    }
    flush(this);
    if (local_1f8.w != (qreal)((long)&local_1f8 + 0x18)) {
      QtPrivate::sizedFree((void *)local_1f8.w,(long)local_1f8.xp << 3);
    }
  }
  if (uStack_148 != local_140) {
    QtPrivate::sizedFree(uStack_148,CONCAT44(iStack_154,local_158) << 3);
  }
  QRegion::~QRegion(&local_218);
LAB_0031bc61:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWidgetRepaintManager::paintAndFlush()
{
    qCInfo(lcWidgetPainting) << "Painting and flushing dirty"
        << "top level" << dirty << "and dirty widgets" << dirtyWidgets;

    const bool updatesDisabled = !tlw->updatesEnabled();
    bool repaintAllWidgets = false;

    const QRect tlwRect = tlw->data->crect;
    if (!updatesDisabled && store->size() != tlwRect.size()) {
        QPlatformIntegration *integration = QGuiApplicationPrivate::platformIntegration();
        if (hasStaticContents() && !store->size().isEmpty()
            && integration->hasCapability(QPlatformIntegration::BackingStoreStaticContents)) {
            // Repaint existing dirty area and newly visible area.
            const QRect clipRect(QPoint(0, 0), store->size());
            const QRegion staticRegion(staticContents(nullptr, clipRect));
            QRegion newVisible(0, 0, tlwRect.width(), tlwRect.height());
            newVisible -= staticRegion;
            dirty += newVisible;
            store->setStaticContents(staticRegion);
        } else {
            // Repaint everything.
            dirty = QRegion(0, 0, tlwRect.width(), tlwRect.height());
            for (int i = 0; i < dirtyWidgets.size(); ++i)
                resetWidget(dirtyWidgets.at(i));
            dirtyWidgets.clear();
            repaintAllWidgets = true;
        }
    }

    if (store->size() != tlwRect.size())
        store->resize(tlwRect.size());

    if (updatesDisabled)
        return;

    // Contains everything that needs repaint.
    QRegion toClean(dirty);

    // Loop through all update() widgets and remove them from the list before they are
    // painted (in case someone calls update() in paintEvent). If the widget is opaque
    // and does not have transparent overlapping siblings, append it to the
    // opaqueNonOverlappedWidgets list and paint it directly without composition.
    QVarLengthArray<QWidget *, 32> opaqueNonOverlappedWidgets;
    for (int i = 0; i < dirtyWidgets.size(); ++i) {
        QWidget *w = dirtyWidgets.at(i);
        QWidgetPrivate *wd = w->d_func();
        if (wd->data.in_destructor)
            continue;

        // Clip with mask() and clipRect().
        wd->dirty &= wd->clipRect();
        wd->clipToEffectiveMask(wd->dirty);

        // Subtract opaque siblings and children.
        bool hasDirtySiblingsAbove = false;
        // We know for sure that the widget isn't overlapped if 'isMoved' is true.
        if (!wd->isMoved)
            wd->subtractOpaqueSiblings(wd->dirty, &hasDirtySiblingsAbove);

        // Make a copy of the widget's dirty region, to restore it in case there is an opaque
        // render-to-texture child that completely covers the widget, because otherwise the
        // render-to-texture child won't be visible, due to its parent widget not being redrawn
        // with a proper blending mask.
        const QRegion dirtyBeforeSubtractedOpaqueChildren = wd->dirty;

        // Scrolled and moved widgets must draw all children.
        if (!wd->isScrolled && !wd->isMoved)
            wd->subtractOpaqueChildren(wd->dirty, w->rect());

        if (wd->dirty.isEmpty() && wd->textureChildSeen)
            wd->dirty = dirtyBeforeSubtractedOpaqueChildren;

        if (wd->dirty.isEmpty()) {
            resetWidget(w);
            continue;
        }

        const QRegion widgetDirty(w != tlw ? wd->dirty.translated(w->mapTo(tlw, QPoint()))
                                           : wd->dirty);
        toClean += widgetDirty;

#if QT_CONFIG(graphicsview)
        if (tlw->d_func()->extra->proxyWidget) {
            resetWidget(w);
            continue;
        }
#endif

        if (!isDrawnInEffect(w) && !hasDirtySiblingsAbove && wd->isOpaque
                && !dirty.intersects(widgetDirty.boundingRect())) {
            opaqueNonOverlappedWidgets.append(w);
        } else {
            resetWidget(w);
            dirty += widgetDirty;
        }
    }
    dirtyWidgets.clear();

    // Find all render-to-texture child widgets (including self).
    // The search is cut at native widget boundaries, meaning that each native child widget
    // has its own list for the subtree below it.
    QTLWExtra *tlwExtra = tlw->d_func()->topData();
    tlwExtra->widgetTextures.clear();
    findAllTextureWidgetsRecursively(tlw, tlw);

    if (toClean.isEmpty()) {
        // Nothing to repaint. However renderToTexture widgets are handled
        // specially, they are not in the regular dirty list, in order to
        // prevent triggering unnecessary backingstore painting when only the
        // texture content changes. Check if we have such widgets in the special
        // dirty list.
        QVarLengthArray<QWidget *, 16> paintPending;
        const int numPaintPending = dirtyRenderToTextureWidgets.size();
        paintPending.reserve(numPaintPending);
        for (int i = 0; i < numPaintPending; ++i) {
            QWidget *w = dirtyRenderToTextureWidgets.at(i);
            paintPending << w;
            resetWidget(w);
        }
        dirtyRenderToTextureWidgets.clear();
        for (int i = 0; i < numPaintPending; ++i) {
            QWidget *w = paintPending[i];
            w->d_func()->sendPaintEvent(w->rect());
            if (w != tlw) {
                QWidget *npw = w->nativeParentWidget();
                if (hasPlatformWindow(w) || (npw && npw != tlw)) {
                    if (!hasPlatformWindow(w))
                        w = npw;
                    markNeedsFlush(w);
                }
            }
        }

        // We might have newly exposed areas on the screen if this function was
        // called from sync(QWidget *, QRegion)), so we have to make sure those
        // are flushed. We also need to composite the renderToTexture widgets.
        flush();

        return;
    }

    for (const auto &tl : tlwExtra->widgetTextures) {
        for (int i = 0; i < tl->count(); ++i) {
            QWidget *w = static_cast<QWidget *>(tl->source(i));
            if (dirtyRenderToTextureWidgets.contains(w)) {
                const QRect rect = tl->geometry(i); // mapped to the tlw already
                // Set a flag to indicate that the paint event for this
                // render-to-texture widget must not to be optimized away.
                w->d_func()->renderToTextureReallyDirty = 1;
                dirty += rect;
                toClean += rect;
            }
        }
    }
    for (int i = 0; i < dirtyRenderToTextureWidgets.size(); ++i)
        resetWidget(dirtyRenderToTextureWidgets.at(i));
    dirtyRenderToTextureWidgets.clear();

#if QT_CONFIG(graphicsview)
    if (tlw->d_func()->extra->proxyWidget) {
        updateStaticContentsSize();
        dirty = QRegion();
        updateRequestSent = false;
        for (const QRect &rect : toClean)
            tlw->d_func()->extra->proxyWidget->update(rect);
        return;
    }
#endif

    store->beginPaint(toClean);

    // Must do this before sending any paint events because
    // the size may change in the paint event.
    updateStaticContentsSize();
    const QRegion dirtyCopy(dirty);
    dirty = QRegion();
    updateRequestSent = false;

    // Paint opaque non overlapped widgets.
    for (int i = 0; i < opaqueNonOverlappedWidgets.size(); ++i) {
        QWidget *w = opaqueNonOverlappedWidgets[i];
        QWidgetPrivate *wd = w->d_func();

        QWidgetPrivate::DrawWidgetFlags flags = QWidgetPrivate::DrawRecursive;
        // Scrolled and moved widgets must draw all children.
        if (!wd->isScrolled && !wd->isMoved)
            flags |= QWidgetPrivate::DontDrawOpaqueChildren;
        if (w == tlw)
            flags |= QWidgetPrivate::DrawAsRoot;

        QRegion toBePainted(wd->dirty);
        resetWidget(w);

        QPoint offset;
        if (w != tlw)
            offset += w->mapTo(tlw, QPoint());
        wd->drawWidget(store->paintDevice(), toBePainted, offset, flags, nullptr, this);
    }

    // Paint the rest with composition.
    if (repaintAllWidgets || !dirtyCopy.isEmpty()) {
        QWidgetPrivate::DrawWidgetFlags flags = QWidgetPrivate::DrawAsRoot | QWidgetPrivate::DrawRecursive
                | QWidgetPrivate::UseEffectRegionBounds;
        tlw->d_func()->drawWidget(store->paintDevice(), dirtyCopy, QPoint(), flags, nullptr, this);
    }

    store->endPaint();

    flush();
}